

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

void Abc_TgFullEnumeration(Abc_TgMan_t *pWork,Abc_TgMan_t *pBest)

{
  byte *pbVar1;
  ulong *puVar2;
  char cVar3;
  char cVar4;
  word *pwVar5;
  ulong uVar6;
  Vec_Int_t *pVVar7;
  word *pwVar8;
  undefined8 uVar9;
  bool bVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  uint uVar24;
  int iVar25;
  ulong *puVar26;
  ulong *puVar27;
  undefined8 *puVar28;
  ulong uVar29;
  undefined8 *puVar30;
  word *pLimit;
  char pFGrps [16];
  uint local_134;
  Abc_TgMan_t local_f8;
  
  if (pWork->nAlgorithm < 1) {
    Abc_TgFirstPermutation(pWork);
    do {
      bVar17 = pWork->pGroup[0].nGVars;
      pwVar8 = pBest->pTruth;
      iVar12 = pWork->nVars;
      uVar21 = (ulong)(uint)(1 << ((char)iVar12 - 6U & 0x1f));
      if (iVar12 < 7) {
        uVar21 = 1;
      }
      do {
        if ((int)uVar21 < 1) goto LAB_00509cf3;
        lVar20 = uVar21 - 1;
        lVar23 = uVar21 - 1;
        uVar21 = uVar21 - 1;
      } while (pwVar8[lVar23] == pWork->pTruth[lVar20]);
      if (pWork->pTruth[lVar20] <= pwVar8[lVar23]) {
        memcpy(pBest,pWork,0xc0);
        iVar12 = pWork->nVars;
        uVar11 = 1 << ((char)iVar12 - 6U & 0x1f);
        if (iVar12 < 7) {
          uVar11 = 1;
        }
        if (0 < (int)uVar11) {
          pwVar5 = pWork->pTruth;
          uVar21 = 0;
          do {
            pwVar8[uVar21] = pwVar5[uVar21];
            uVar21 = uVar21 + 1;
          } while (uVar11 != uVar21);
        }
        pBest->pTruth = pwVar8;
      }
LAB_00509cf3:
      if (pWork->fPhased == 0) {
        if ('\0' < (char)bVar17) {
          uVar21 = 0;
          do {
            cVar4 = pWork->pPerm[uVar21];
            if (uVar21 == 0) {
              lVar20 = 0;
            }
            else {
              cVar3 = pWork->symPhase[cVar4];
              uVar29 = uVar21;
              do {
                if (pWork->symPhase[local_f8.pPerm[(uVar29 - 1 & 0xffffffff) - 0x1c]] <= cVar3)
                goto LAB_00509d45;
                local_f8.pPerm[uVar29 - 0x1c] = local_f8.pPerm[(uVar29 - 1 & 0xffffffff) - 0x1c];
                bVar10 = 1 < (long)uVar29;
                uVar29 = uVar29 - 1;
              } while (bVar10);
              uVar29 = 0;
LAB_00509d45:
              lVar20 = (long)(int)uVar29;
            }
            local_f8.pPerm[lVar20 + -0x1c] = cVar4;
            uVar21 = uVar21 + 1;
          } while (uVar21 != (uint)(int)(char)bVar17);
        }
        if (bVar17 != 0) {
          uVar11 = -1 << (bVar17 & 0x1f);
          if (0xfffffffd < uVar11) {
            uVar11 = 0xfffffffe;
          }
          uVar13 = 0;
          do {
            uVar13 = uVar13 + 1;
            lVar20 = 0;
            do {
              lVar23 = lVar20;
              lVar20 = lVar23 + 1;
            } while ((uVar13 >> ((uint)lVar23 & 0x1f) & 1) == 0);
            bVar17 = local_f8.pPerm[lVar23 + -0x1c];
            iVar22 = iVar12 + -6;
            uVar24 = 1 << ((byte)iVar22 & 0x1f);
            if (-1 < (char)bVar17) {
              do {
                if (pWork->symPhase[bVar17] != '\0') {
                  bVar15 = pWork->pPermTRev[bVar17];
                  iVar18 = (int)(char)bVar15;
                  puVar27 = pWork->pTruth;
                  if (iVar12 < 7) {
                    bVar16 = (byte)(1 << (bVar15 & 0x1f));
                    *puVar27 = (s_Truths6[iVar18] & *puVar27) >> (bVar16 & 0x3f) |
                               *puVar27 << (bVar16 & 0x3f) & s_Truths6[iVar18];
                  }
                  else if ((char)bVar15 < '\x06') {
                    if (iVar22 != 0x1f) {
                      uVar21 = s_Truths6[iVar18];
                      uVar29 = 0;
                      do {
                        bVar16 = (byte)(1 << (bVar15 & 0x1f));
                        puVar27[uVar29] =
                             (puVar27[uVar29] & uVar21) >> (bVar16 & 0x3f) |
                             puVar27[uVar29] << (bVar16 & 0x3f) & uVar21;
                        uVar29 = uVar29 + 1;
                      } while (uVar24 != uVar29);
                    }
                  }
                  else if (iVar22 != 0x1f) {
                    puVar2 = puVar27 + (int)uVar24;
                    bVar16 = (byte)(iVar18 + -6);
                    uVar14 = 1 << (bVar16 & 0x1f);
                    iVar25 = 2 << (bVar16 & 0x1f);
                    uVar21 = 1;
                    if (1 < (int)uVar14) {
                      uVar21 = (ulong)uVar14;
                    }
                    puVar26 = puVar27 + (int)uVar14;
                    do {
                      if (iVar18 + -6 != 0x1f) {
                        uVar29 = 0;
                        do {
                          uVar6 = puVar27[uVar29];
                          puVar27[uVar29] = puVar26[uVar29];
                          puVar26[uVar29] = uVar6;
                          uVar29 = uVar29 + 1;
                        } while (uVar21 != uVar29);
                      }
                      puVar27 = puVar27 + iVar25;
                      puVar26 = puVar26 + iVar25;
                    } while (puVar27 < puVar2);
                  }
                  pWork->uPhase = pWork->uPhase ^ 1 << (bVar15 & 0x1f);
                }
                bVar17 = pWork->symLink[bVar17];
              } while (-1 < (char)bVar17);
            }
            if (iVar12 < 7) {
              uVar24 = 1;
            }
            uVar21 = (ulong)uVar24;
            do {
              if ((int)uVar21 < 1) goto LAB_00509f5e;
              lVar20 = uVar21 - 1;
              lVar23 = uVar21 - 1;
              uVar21 = uVar21 - 1;
            } while (pwVar8[lVar23] == pWork->pTruth[lVar20]);
            if (pWork->pTruth[lVar20] <= pwVar8[lVar23]) {
              memcpy(pBest,pWork,0xc0);
              iVar12 = pWork->nVars;
              uVar24 = 1 << ((char)iVar12 - 6U & 0x1f);
              if (iVar12 < 7) {
                uVar24 = 1;
              }
              if (0 < (int)uVar24) {
                pwVar5 = pWork->pTruth;
                uVar21 = 0;
                do {
                  pwVar8[uVar21] = pwVar5[uVar21];
                  uVar21 = uVar21 + 1;
                } while (uVar24 != uVar21);
              }
              pBest->pTruth = pwVar8;
            }
LAB_00509f5e:
          } while ((uVar13 ^ uVar11) != 0xffffffff);
        }
      }
      iVar12 = Abc_TgNextPermutation(pWork);
    } while (iVar12 != 0);
  }
  else {
    uVar11 = 1 << ((char)pBest->nVars - 6U & 0x1f);
    if (pBest->nVars < 7) {
      uVar11 = 1;
    }
    if (0 < (int)uVar11) {
      memset(pBest->pTruth,0xff,(ulong)uVar11 << 3);
    }
    if (pWork->fPhased == 0) {
      pVVar7 = pWork->vPhase;
      cVar4 = pWork->pGroup[0].nGVars;
      memcpy(&local_f8,pWork,0xc0);
      uVar11 = 1 << ((char)pWork->nVars - 6U & 0x1f);
      if (pWork->nVars < 7) {
        uVar11 = 1;
      }
      if (0 < (int)uVar11) {
        pwVar8 = pWork->pTruth;
        lVar20 = 0;
        do {
          *(undefined8 *)((long)&Abc_TgPhaseEnumerationScc_pCopy + lVar20) =
               *(undefined8 *)((long)pwVar8 + lVar20);
          lVar20 = lVar20 + 8;
        } while ((ulong)uVar11 << 3 != lVar20);
      }
      local_f8.pTruth = &Abc_TgPhaseEnumerationScc_pCopy;
      if (0 < pVVar7->nSize) {
        iVar12 = local_f8.nVars + -6;
        uVar13 = 1 << ((byte)iVar12 & 0x1f);
        lVar20 = 0;
        local_134 = 0;
        uVar11 = local_f8.uPhase;
        do {
          uVar24 = pVVar7->pArray[lVar20];
          if ('\0' < cVar4) {
            lVar23 = 0;
            do {
              if (((local_134 ^ uVar24) >> ((uint)lVar23 & 0x1f) & 1) != 0) {
                for (bVar17 = pWork->pFGrps[lVar23]; -1 < (char)bVar17;
                    bVar17 = local_f8.symLink[bVar17]) {
                  if (local_f8.symPhase[bVar17] != '\0') {
                    bVar15 = local_f8.pPermTRev[bVar17];
                    uVar14 = (uint)(char)bVar15;
                    if (local_f8.nVars < 7) {
                      bVar15 = (byte)(1 << (bVar15 & 0x1f));
                      Abc_TgPhaseEnumerationScc_pCopy =
                           (s_Truths6[(int)uVar14] & Abc_TgPhaseEnumerationScc_pCopy) >>
                           (bVar15 & 0x3f) |
                           Abc_TgPhaseEnumerationScc_pCopy << (bVar15 & 0x3f) &
                           s_Truths6[(int)uVar14];
                    }
                    else if ((char)bVar15 < '\x06') {
                      if (iVar12 != 0x1f) {
                        uVar21 = s_Truths6[(int)uVar14];
                        puVar27 = &Abc_TgPhaseEnumerationScc_pCopy;
                        uVar29 = (ulong)uVar13;
                        do {
                          bVar16 = (byte)(1 << (bVar15 & 0x1f));
                          *puVar27 = (*puVar27 & uVar21) >> (bVar16 & 0x3f) |
                                     *puVar27 << (bVar16 & 0x3f) & uVar21;
                          puVar27 = puVar27 + 1;
                          uVar29 = uVar29 - 1;
                        } while (uVar29 != 0);
                      }
                    }
                    else if (iVar12 != 0x1f) {
                      bVar15 = (byte)(uVar14 - 6);
                      uVar19 = 1 << (bVar15 & 0x1f);
                      iVar22 = 2 << (bVar15 & 0x1f);
                      uVar21 = 1;
                      if (1 < (int)uVar19) {
                        uVar21 = (ulong)uVar19;
                      }
                      puVar30 = &Abc_TgPhaseEnumerationScc_pCopy;
                      puVar28 = &Abc_TgPhaseEnumerationScc_pCopy + (int)uVar19;
                      do {
                        if (uVar14 - 6 != 0x1f) {
                          uVar29 = 0;
                          do {
                            uVar9 = puVar30[uVar29];
                            puVar30[uVar29] = puVar28[uVar29];
                            puVar28[uVar29] = uVar9;
                            uVar29 = uVar29 + 1;
                          } while (uVar21 != uVar29);
                        }
                        puVar30 = puVar30 + iVar22;
                        puVar28 = puVar28 + iVar22;
                      } while (puVar30 < &Abc_TgPhaseEnumerationScc_pCopy + (int)uVar13);
                    }
                    uVar11 = uVar11 ^ 1 << (uVar14 & 0x1f);
                  }
                }
              }
              lVar23 = lVar23 + 1;
              local_f8.uPhase = uVar11;
            } while (lVar23 != cVar4);
          }
          Abc_TgPermEnumerationScc(&local_f8,pBest);
          lVar20 = lVar20 + 1;
          local_134 = uVar24;
        } while (lVar20 < pVVar7->nSize);
      }
    }
    else {
      Abc_TgPermEnumerationScc(pWork,pBest);
    }
  }
  pbVar1 = (byte *)((long)&pBest->uPhase + 3);
  *pbVar1 = *pbVar1 | 0x40;
  return;
}

Assistant:

static void Abc_TgFullEnumeration(Abc_TgMan_t * pWork, Abc_TgMan_t * pBest)
{
    if (pWork->nAlgorithm > 0)
    {
        Abc_TtFill(pBest->pTruth, Abc_TtWordNum(pBest->nVars));
        Abc_TgPhaseEnumerationScc(pWork, pBest);
    }
    else 
    {
        Abc_TgFirstPermutation(pWork);
        do Abc_TgPhaseEnumeration(pWork, pBest);
        while (Abc_TgNextPermutation(pWork));
    }
    pBest->uPhase |= 1 << 30;
}